

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void SetWindowSize(ImGuiWindow *window,ImVec2 *size,ImGuiSetCond cond)

{
  float fVar1;
  int iVar2;
  
  if (cond == 0 || (window->SetWindowSizeAllowFlags & cond) != 0) {
    window->SetWindowSizeAllowFlags = window->SetWindowSizeAllowFlags & 0xfffffff1;
    if (size->x <= 0.0) {
      window->AutoFitOnlyGrows = false;
      iVar2 = 2;
    }
    else {
      (window->SizeFull).x = size->x;
      iVar2 = 0;
    }
    window->AutoFitFramesX = iVar2;
    fVar1 = size->y;
    if (0.0 < fVar1) {
      window->AutoFitFramesY = 0;
      (window->SizeFull).y = fVar1;
      return;
    }
    window->AutoFitFramesY = 2;
    window->AutoFitOnlyGrows = false;
  }
  return;
}

Assistant:

static void SetWindowSize(ImGuiWindow* window, const ImVec2& size, ImGuiSetCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowSizeAllowFlags & cond) == 0)
        return;
    window->SetWindowSizeAllowFlags &= ~(ImGuiSetCond_Once | ImGuiSetCond_FirstUseEver | ImGuiSetCond_Appearing);

    // Set
    if (size.x > 0.0f)
    {
        window->AutoFitFramesX = 0;
        window->SizeFull.x = size.x;
    }
    else
    {
        window->AutoFitFramesX = 2;
        window->AutoFitOnlyGrows = false;
    }
    if (size.y > 0.0f)
    {
        window->AutoFitFramesY = 0;
        window->SizeFull.y = size.y;
    }
    else
    {
        window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = false;
    }
}